

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O0

void curl_slist_free_all(curl_slist *list)

{
  curl_slist *pcVar1;
  curl_slist *local_20;
  curl_slist *item;
  curl_slist *next;
  curl_slist *list_local;
  
  local_20 = list;
  if (list != (curl_slist *)0x0) {
    do {
      pcVar1 = local_20->next;
      (*Curl_cfree)(local_20->data);
      local_20->data = (char *)0x0;
      (*Curl_cfree)(local_20);
      local_20 = pcVar1;
    } while (pcVar1 != (curl_slist *)0x0);
  }
  return;
}

Assistant:

void curl_slist_free_all(struct curl_slist *list)
{
  struct curl_slist     *next;
  struct curl_slist     *item;

  if(!list)
    return;

  item = list;
  do {
    next = item->next;
    Curl_safefree(item->data);
    free(item);
    item = next;
  } while(next);
}